

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double gammainv(double p,double k,double th)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int local_5c;
  int m;
  double cvar;
  double sigma2;
  double mu;
  double del;
  double xi;
  double x;
  double oup;
  double th_local;
  double k_local;
  double p_local;
  
  if ((p < 0.0) || (1.0 < p)) {
    printf("Probablity Values can only take values between 0.0 and 1.0");
    exit(1);
  }
  if ((0.0 < k) && (0.0 < th)) {
    if ((p == 0.0) && (!NAN(p))) {
      x = 0.0;
    }
    if ((p == 1.0) && (!NAN(p))) {
      x = 1.79e+308;
    }
    if ((0.0 < p) && (p < 1.0)) {
      dVar1 = log(k + 1.0);
      dVar2 = log(k);
      dVar3 = log(k);
      dVar4 = sqrt((dVar1 - dVar2) * 2.0);
      dVar5 = erfcinv(p * 2.0);
      del = exp(-dVar4 * dVar5 + (dVar1 - dVar2) * -0.5 + dVar3);
      mu = 1.0;
      dVar1 = eps(2.2251e-308);
      local_5c = 0;
      while (dVar1 * del < ABS(mu) && local_5c < 1000) {
        dVar2 = gammacdf(del,k,1.0);
        dVar3 = gammapdf(del,k,1.0);
        dVar3 = r8_max(dVar3,2.2251e-308);
        mu = (dVar2 - p) / dVar3;
        local_5c = local_5c + 1;
        xi = del - mu;
        if (xi <= 0.0) {
          xi = del / 10.0;
          mu = del - xi;
        }
        del = xi;
      }
      x = del * th;
    }
    return x;
  }
  printf("Gamma Distribution parameters must be positive and real.");
  exit(1);
}

Assistant:

double gammainv(double p, double k, double th) {
	double oup,x,xi,del,mu,sigma2,cvar;
	int m;
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	if (p == 0.) {
		oup = 0.0;
	} 
	
	if ( p == 1.) {
		oup = XINFVAL;
	}
	
	if ( p > 0.0 && p < 1.0) {
		// Use Newton's Method to find cdf inverse of gamma distribution
		
		// Initialization is based on lognormal distribution with
		// mean and variance k
		
		sigma2 = log(1+k) - log(k);
		mu = log(k) - 0.5 * sigma2;
		xi = exp(mu - sqrt(2. * sigma2) * erfcinv(2*p));
		
		del = 1.0;
		
		cvar = eps(XNINFVAL);
		m = 0;
		
		
		//Iterations
		
		while ( ( fabs(del) > cvar * xi) &&  (m < 1000)) {
			del = (gammacdf(xi,k,1.0) - p) / r8_max(gammapdf(xi,k,1.0), XNINFVAL);
			//printf("%g %g \n",xi*cvar,del);
			m++;
			x = xi - del;
			
			if (x <= 0.) {
				x = xi / 10.;
				del = xi - x;
			}
			xi = x;
		}
		oup = xi * th;
	}
	
	return oup;
}